

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v10::format_system_error(buffer<char> *out,int error_code,char *message)

{
  error_category *__cat;
  char *value;
  error_code __ec;
  system_error local_78 [48];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_48;
  undefined1 auStack_40 [8];
  error_code ec;
  char *message_local;
  int error_code_local;
  buffer<char> *out_local;
  
  ec._M_cat = (error_category *)message;
  __cat = (error_category *)std::_V2::generic_category();
  std::error_code::error_code((error_code *)auStack_40,error_code,__cat);
  local_48 = std::back_inserter<fmt::v10::detail::buffer<char>>(out);
  __ec._0_8_ = (ulong)auStack_40 & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(local_78,__ec,(char *)ec._M_cat);
  value = (char *)std::runtime_error::what();
  detail::write<char,std::back_insert_iterator<fmt::v10::detail::buffer<char>>>(local_48,value);
  std::system_error::~system_error(local_78);
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  const char* message) noexcept {
  FMT_TRY {
    auto ec = std::error_code(error_code, std::generic_category());
    write(std::back_inserter(out), std::system_error(ec, message).what());
    return;
  }